

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O3

void __thiscall
muduo::detail::FixedBuffer<4000000>::append(FixedBuffer<4000000> *this,char *buf,size_t len)

{
  char **ppcVar1;
  
  ppcVar1 = &this->cur_;
  if (len < (ulong)(long)((int)ppcVar1 - (int)this->cur_)) {
    memcpy(this->cur_,buf,len);
    *ppcVar1 = *ppcVar1 + len;
  }
  return;
}

Assistant:

void append(const char* /*restrict*/ buf, size_t len)
  {
    // FIXME: append partially
    if (implicit_cast<size_t>(avail()) > len)
    {
      memcpy(cur_, buf, len);
      cur_ += len;
    }
  }